

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

void __thiscall
CCheckQueueControl<UniqueCheck>::~CCheckQueueControl(CCheckQueueControl<UniqueCheck> *this)

{
  long lVar1;
  long in_FS_OFFSET;
  string lockname;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->fDone == false) && (this->pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0)) {
    CCheckQueue<UniqueCheck>::Loop((CCheckQueue<UniqueCheck> *)this->pqueue,true);
    this->fDone = true;
  }
  if (this->pqueue != (CCheckQueue<FakeCheckCheckCompletion> *)0x0) {
    pthread_mutex_unlock((pthread_mutex_t *)&this->pqueue->m_control_mutex);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

~CCheckQueueControl()
    {
        if (!fDone)
            Wait();
        if (pqueue != nullptr) {
            LEAVE_CRITICAL_SECTION(pqueue->m_control_mutex);
        }
    }